

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptBitsDel(poptBits bits,char *s)

{
  byte bVar1;
  size_t size;
  int iVar2;
  ulong uVar3;
  uint32_t h1;
  uint32_t h0;
  uint32_t local_20;
  uint32_t local_1c;
  
  if (s == (char *)0x0) {
    size = 0;
  }
  else {
    size = strlen(s);
  }
  local_1c = 0;
  local_20 = 0;
  iVar2 = -0x14;
  if (size != 0 && bits != (poptBits)0x0) {
    poptJlu32lpair(s,size,&local_1c,&local_20);
    if (_poptBitsK == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      uVar3 = 0;
      do {
        bVar1 = (byte)((ulong)local_1c % (ulong)_poptBitsM) & 0x1f;
        bits[(ulong)local_1c % (ulong)_poptBitsM >> 5].bits[0] =
             bits[(ulong)local_1c % (ulong)_poptBitsM >> 5].bits[0] &
             (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
        uVar3 = uVar3 + 1;
        local_1c = local_1c + local_20;
      } while (uVar3 < _poptBitsK);
    }
  }
  return iVar2;
}

Assistant:

int poptBitsDel(poptBits bits, const char * s)
{
    size_t ns = (s ? strlen(s) : 0);
    uint32_t h0 = 0;
    uint32_t h1 = 0;

    if (bits == NULL || ns == 0)
	return POPT_ERROR_NULLARG;

    poptJlu32lpair(s, ns, &h0, &h1);

    for (ns = 0; ns < (size_t)_poptBitsK; ns++) {
        uint32_t h = h0 + ns * h1;
        uint32_t ix = (h % _poptBitsM);
        PBM_CLR(ix, bits);
    }
    return 0;
}